

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype.cpp
# Opt level: O2

void __thiscall Contact::Contact(Contact *this,string *name,shared_ptr<Address> *address)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  if ((address->super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    (this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::make_shared<Address,Address&>((Address *)&this->work_address);
  }
  return;
}

Assistant:

explicit Contact(std::string name, std::shared_ptr<Address> address)
		:	name{std::move(name)},
			work_address{address ? std::make_shared<Address>(*address) : nullptr}
	{}